

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wchar.cpp
# Opt level: O3

char16_t * PAL_wcsstr(char16_t *string,char16_t *strCharSet)

{
  char16_t *pcVar1;
  int iVar2;
  char16_t cVar3;
  long lVar4;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  if (strCharSet != (char16_t *)0x0 && string != (char16_t *)0x0) {
    if (*strCharSet == L'\0') {
      return string;
    }
    if (*string != L'\0') {
      do {
        iVar2 = 1;
        lVar4 = 0;
        cVar3 = *strCharSet;
        while( true ) {
          if (string[lVar4] == L'\0') {
            return (char16_t *)0x0;
          }
          if (string[lVar4] != cVar3) break;
          lVar4 = (long)iVar2;
          cVar3 = strCharSet[lVar4];
          iVar2 = iVar2 + 1;
          if (cVar3 == L'\0') {
            return string;
          }
        }
        pcVar1 = string + 1;
        string = string + 1;
        if (*pcVar1 == L'\0') {
          return (char16_t *)0x0;
        }
      } while( true );
    }
  }
  return (char16_t *)0x0;
}

Assistant:

const char16_t *
__cdecl
PAL_wcsstr(
        const char16_t *string,
        const char16_t *strCharSet)
{
    char16_t *ret = NULL;
    int i;

    PERF_ENTRY(wcsstr);
    ENTRY("wcsstr (string=%p (%S), strCharSet=%p (%S))\n",
      string?string:W16_NULLSTRING,
      string?string:W16_NULLSTRING, strCharSet?strCharSet:W16_NULLSTRING, strCharSet?strCharSet:W16_NULLSTRING);

    if (string == NULL)
    {
        ret = NULL;
        goto leave;
    }

    if (strCharSet == NULL)
    {
        ret = NULL;
        goto leave;
    }

    if (*strCharSet == 0)
    {
        ret = (char16_t *)string;
        goto leave;
    }

    while (*string != 0)
    {
        i = 0;
        while (1)
        {
            if (*(strCharSet + i) == 0)
            {
                ret = (char16_t *) string;
                goto leave;
            }
            else if (*(string + i) == 0)
            {
                ret = NULL;
                goto leave;
            }
            if (*(string + i) != *(strCharSet + i))
            {
                break;
            }

            i++;
        }
        string++;
    }

 leave:
    LOGEXIT("wcsstr returning char16_t %p (%S)\n", ret?ret:W16_NULLSTRING, ret?ret:W16_NULLSTRING);
    PERF_EXIT(wcsstr);
    return ret;
}